

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_xor_inplace(_Bool copy_on_write)

{
  _Bool cow;
  _Bool _Var1;
  roaring_bitmap_t *prVar2;
  roaring_bitmap_t *prVar3;
  roaring_bitmap_t *x2;
  roaring_bitmap_t *x1;
  roaring_bitmap_t *r_00;
  roaring_bitmap_t *r_01;
  uint64_t uVar4;
  byte in_DIL;
  int i_2;
  _Bool is_equal;
  roaring_bitmap_t *copy;
  roaring_bitmap_t *expected;
  int j;
  int i_1;
  roaring_bitmap_t *r [10];
  uint32_t i;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  int iVar5;
  undefined4 in_stack_ffffffffffffff6c;
  roaring_bitmap_t *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  uint uVar6;
  int in_stack_ffffffffffffff84;
  uint uVar7;
  double in_stack_ffffffffffffff88;
  double in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  roaring_bitmap_t *in_stack_ffffffffffffffa0;
  roaring_bitmap_t *in_stack_ffffffffffffffb8;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  uint local_1c;
  
  cow = (_Bool)(in_DIL & 1);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,cow);
  prVar2 = roaring_bitmap_create();
  roaring_bitmap_set_copy_on_write(prVar2,cow);
  for (local_1c = 0; local_1c < 300; local_1c = local_1c + 1) {
    if ((local_1c & 1) == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffffa0,
                         (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    if (local_1c % 3 == 0) {
      roaring_bitmap_add(in_stack_ffffffffffffffa0,
                         (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
  }
  roaring_bitmap_xor_inplace(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  roaring_bitmap_get_cardinality(in_stack_ffffffffffffff70);
  _assert_int_equal((unsigned_long)in_stack_ffffffffffffff70,
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff5c);
  roaring_bitmap_free((roaring_bitmap_t *)0x106f20);
  roaring_bitmap_free((roaring_bitmap_t *)0x106f2d);
  prVar2 = gen_bitmap(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                      in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (int)in_stack_ffffffffffffff78);
  prVar3 = gen_bitmap(in_stack_ffffffffffffff90,(double)prVar2,in_stack_ffffffffffffff84,
                      in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (int)in_stack_ffffffffffffff78);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
             (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  x2 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                  (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  x1 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                  (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78);
  prVar2 = gen_bitmap((double)prVar3,(double)prVar2,in_stack_ffffffffffffff84,
                      in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                      (int)in_stack_ffffffffffffff78);
  prVar3 = (roaring_bitmap_t *)0x0;
  uVar7 = 0;
  while (uVar6 = uVar7, *(long *)(&stack0xffffffffffffff88 + (long)(int)uVar7 * 8) != 0) {
    while (uVar6 = uVar6 + 1, *(long *)(&stack0xffffffffffffff88 + (long)(int)uVar6 * 8) != 0) {
      r_00 = synthesized_xor(prVar3,prVar2);
      r_01 = roaring_bitmap_copy(r_00);
      roaring_bitmap_set_copy_on_write(r_01,cow);
      roaring_bitmap_xor_inplace(x1,x2);
      _Var1 = roaring_bitmap_equals(r_00,r_01);
      in_stack_ffffffffffffff6c = CONCAT13(_Var1,(int3)in_stack_ffffffffffffff6c);
      if (!_Var1) {
        printf("problem with i=%d j=%d\n",(ulong)uVar7,(ulong)uVar6);
        uVar4 = roaring_bitmap_get_cardinality(r_01);
        in_stack_ffffffffffffff64 = (uint)uVar4;
        uVar4 = roaring_bitmap_get_cardinality(r_01);
        printf("copy\'s cardinality  is %d and expected\'s is %d\n",(ulong)in_stack_ffffffffffffff64
               ,uVar4 & 0xffffffff);
        show_difference((roaring_bitmap_t *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (roaring_bitmap_t *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      _assert_true((unsigned_long)r_01,
                   (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
      roaring_bitmap_free((roaring_bitmap_t *)0x1071bc);
      roaring_bitmap_free((roaring_bitmap_t *)0x1071c6);
    }
    uVar7 = uVar7 + 1;
  }
  iVar5 = 0;
  while (*(long *)(&stack0xffffffffffffff88 + (long)iVar5 * 8) != 0) {
    roaring_bitmap_free((roaring_bitmap_t *)0x10720c);
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void test_xor_inplace(bool copy_on_write) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r1, copy_on_write);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r2, copy_on_write);

    for (uint32_t i = 0; i < 300; ++i) {
        if (i % 2 == 0) roaring_bitmap_add(r1, i);
        if (i % 3 == 0) roaring_bitmap_add(r2, i);
    }
    roaring_bitmap_xor_inplace(r1, r2);
    assert_int_equal(roaring_bitmap_get_cardinality(r1), 166 - 16);

    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);

    // some tougher tests on synthetic data

    roaring_bitmap_t *r[] = {
        // ascending density, last containers might be runs
        gen_bitmap(0.0, 1e-6, 1, 0, 0, 1000000),
        // descending density, first containers might be runs
        gen_bitmap(1.0, -1e-6, 1, 0, 0, 1000000),
        // uniformly rather sparse
        gen_bitmap(1e-5, 0.0, 1, 0, 0, 2000000),
        // uniformly rather sparse with runs
        gen_bitmap(1e-5, 0.0, 3, 0, 0, 2000000),
        // uniformly rather dense
        gen_bitmap(1e-1, 0.0, 1, 0, 0, 2000000),
        // ascending density but never too dense
        gen_bitmap(0.001, 1e-7, 1, 0, 0, 1000000),
        // ascending density but very sparse
        gen_bitmap(0.0, 1e-10, 1, 0, 0, 1000000),
        // descending with a gap
        gen_bitmap(0.5, -1e-6, 1, 600000, 800000, 1000000),
        //  gap elsewhere
        gen_bitmap(1, -1e-6, 1, 300000, 500000, 1000000),
        0  // sentinel
    };

    for (int i = 0; r[i]; ++i) {
        for (int j = i + 1; r[j]; ++j) {
            roaring_bitmap_t *expected = synthesized_xor(r[i], r[j]);
            roaring_bitmap_t *copy = roaring_bitmap_copy(r[i]);
            roaring_bitmap_set_copy_on_write(copy, copy_on_write);

            roaring_bitmap_xor_inplace(copy, r[j]);

            bool is_equal = roaring_bitmap_equals(expected, copy);
            if (!is_equal) {
                printf("problem with i=%d j=%d\n", i, j);
                printf("copy's cardinality  is %d and expected's is %d\n",
                       (int)roaring_bitmap_get_cardinality(copy),
                       (int)roaring_bitmap_get_cardinality(expected));
                show_difference(copy, expected);
            }

            assert_true(is_equal);
            roaring_bitmap_free(expected);
            roaring_bitmap_free(copy);
        }
    }
    for (int i = 0; r[i]; ++i) roaring_bitmap_free(r[i]);
}